

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_overwrite_double(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  double dVar5;
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_200 [128];
  undefined1 local_180 [368];
  
  bson_init(local_180);
  cVar1 = bson_append_double(0x4093487e5c91d14e,local_180,"key",0xffffffffffffffff);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_double (&b, \"key\", -1, 1234.1234)";
    uVar3 = 0x1cd;
  }
  else {
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    if (cVar1 == '\0') {
      pcVar4 = "bson_iter_init_find (&iter, &b, \"key\")";
      uVar3 = 0x1ce;
    }
    else {
      iVar2 = bson_iter_type(auStack_200);
      if (iVar2 == 1) {
        bson_iter_overwrite_double(0x40b2211f97247454,auStack_200);
        cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
        if (cVar1 == '\0') {
          pcVar4 = "bson_iter_init_find (&iter, &b, \"key\")";
          uVar3 = 0x1d1;
        }
        else {
          iVar2 = bson_iter_type(auStack_200);
          if (iVar2 == 1) {
            dVar5 = (double)bson_iter_double(auStack_200);
            if ((dVar5 == 4641.1234) && (!NAN(dVar5))) {
              bson_destroy(local_180);
              return;
            }
            fprintf(_stderr,
                    "FAIL\n\nAssert Failure: (line#%d)bson_iter_double (&iter) == 4641.1234\n",0x1d3
                   );
            abort();
          }
          pcVar4 = "BSON_ITER_HOLDS_DOUBLE (&iter)";
          uVar3 = 0x1d2;
        }
      }
      else {
        pcVar4 = "BSON_ITER_HOLDS_DOUBLE (&iter)";
        uVar3 = 0x1cf;
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar3,"test_bson_iter_overwrite_double",pcVar4);
  abort();
}

Assistant:

static void
test_bson_iter_overwrite_double (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   BSON_ASSERT (bson_append_double (&b, "key", -1, 1234.1234));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_DOUBLE (&iter));
   bson_iter_overwrite_double (&iter, 4641.1234);
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_DOUBLE (&iter));
   BSON_ASSERT_CMPINT (bson_iter_double (&iter), ==, 4641.1234);
   bson_destroy (&b);
}